

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_pwd.c
# Opt level: O1

err_t cmdPwdReadShare_internal
                (cmd_pwd_t *pwd,size_t scount,size_t len,bool_t crc,char **shares,cmd_pwd_t spwd)

{
  bool bVar1;
  cmd_pwd_t *ppcVar2;
  octet *epki;
  err_t eVar3;
  uint uVar4;
  bool_t bVar5;
  octet *si;
  size_t sVar6;
  char *dest;
  uint uVar7;
  octet *poVar8;
  size_t sVar9;
  ulong uVar10;
  long lVar11;
  size_t epki_len_max;
  size_t epki_len;
  size_t local_78;
  octet *local_70;
  char **local_68;
  size_t epki_len_min;
  cmd_pwd_t *local_58;
  octet *local_50;
  size_t local_48;
  size_t local_40;
  size_t share_len;
  
  *pwd = (cmd_pwd_t)0x0;
  local_70 = (octet *)spwd;
  local_68 = shares;
  if (len == 0) {
    epki_len = cmdFileSize(*shares);
    if (epki_len == 0xffffffffffffffff) {
      return 0xcf;
    }
    uVar10 = 8;
    do {
      eVar3 = bpkiShareWrap((octet *)0x0,&epki_len_min,(octet *)0x0,uVar10 + 9,(octet *)0x0,0,
                            (octet *)0x0,10000);
      if (eVar3 != 0) {
        return eVar3;
      }
      eVar3 = bpkiShareWrap((octet *)0x0,&epki_len_max,(octet *)0x0,uVar10 + 9,(octet *)0x0,0,
                            (octet *)0x0,0xffffffffffffffff);
      if (eVar3 != 0) {
        return eVar3;
      }
      if ((epki_len_min <= epki_len) && (epki_len <= epki_len_max)) {
        len = uVar10 + 8;
        goto LAB_00105c49;
      }
      uVar10 = uVar10 + 8;
    } while (uVar10 < 0x19);
    len = 0x28;
LAB_00105c49:
    shares = (char **)0x132;
    if (0x20 < len) {
      return 0x132;
    }
  }
  else {
    eVar3 = bpkiShareWrap((octet *)0x0,&epki_len_min,(octet *)0x0,len + 1,(octet *)0x0,0,
                          (octet *)0x0,10000);
    if (eVar3 != 0) {
      return eVar3;
    }
    eVar3 = bpkiShareWrap((octet *)0x0,&epki_len_max,(octet *)0x0,len + 1,(octet *)0x0,0,
                          (octet *)0x0,0xffffffffffffffff);
    if (eVar3 != 0) {
      return eVar3;
    }
  }
  local_78 = len + 1;
  lVar11 = local_78 * scount;
  si = (octet *)blobCreate(epki_len_max + local_78 + lVar11);
  if (si == (octet *)0x0) {
    si = (octet *)*pwd;
LAB_00105dcf:
    blobClose(si);
    eVar3 = 0x6e;
  }
  else {
    local_50 = si + lVar11;
    local_40 = epki_len_max;
    local_58 = pwd;
    if (scount != 0) {
      sVar9 = 0;
      poVar8 = si;
      sVar6 = local_78;
      do {
        uVar4 = cmdFileReadAll((void *)0x0,&epki_len,local_68[sVar9]);
        epki = local_50;
        if ((((uVar4 == 0) && (uVar7 = 0x132, uVar4 = uVar7, epki_len_min <= epki_len)) &&
            (epki_len <= epki_len_max)) &&
           (uVar4 = cmdFileReadAll(local_50,&epki_len,local_68[sVar9]), sVar6 = local_78, uVar4 == 0
           )) {
          local_48 = epki_len;
          sVar6 = strLen((char *)local_70);
          uVar4 = bpkiShareUnwrap(poVar8,&share_len,epki,local_48,local_70,sVar6);
          sVar6 = local_78;
          if ((uVar4 != 0) || (bVar1 = true, uVar4 = uVar7, share_len != local_78))
          goto LAB_00105d59;
        }
        else {
LAB_00105d59:
          blobClose(si);
          bVar1 = false;
          shares = (char **)(ulong)uVar4;
        }
        if (!bVar1) {
          return (err_t)shares;
        }
        sVar9 = sVar9 + 1;
        poVar8 = poVar8 + sVar6;
      } while (scount != sVar9);
    }
    poVar8 = local_50 + local_40 + 1;
    eVar3 = belsRecover2(poVar8,scount,len,si);
    if (eVar3 == 0) {
      if (crc == 0) {
        eVar3 = 0;
        bVar1 = true;
      }
      else {
        beltMACStart(si,poVar8,len - 8);
        beltMACStepA(poVar8,len - 8,si);
        bVar5 = beltMACStepV(poVar8 + (len - 8),si);
        bVar1 = bVar5 != 0;
        eVar3 = (uint)(bVar5 == 0) << 9;
      }
      ppcVar2 = local_58;
      if (bVar1) {
        dest = (char *)blobCreate(len * 2 + 1);
        *ppcVar2 = dest;
        if (dest != (char *)0x0) {
          hexFrom(dest,poVar8,len);
          blobClose(si);
          return 0;
        }
        goto LAB_00105dcf;
      }
    }
    blobClose(si);
  }
  return eVar3;
}

Assistant:

static err_t cmdPwdReadShare_internal(cmd_pwd_t* pwd, size_t scount,
	size_t len, bool_t crc, char* shares[], const cmd_pwd_t spwd)
{
	err_t code;
	size_t epki_len;
	size_t epki_len_min;
	size_t epki_len_max;
	void* stack;
	octet* share;
	octet* state;
	octet* epki;
	octet* pwd_bin;
	size_t pos;
	// pre
	ASSERT(memIsValid(pwd, sizeof(cmd_pwd_t)));
	ASSERT(cmdPwdIsValid(spwd));
	ASSERT(2 <= scount && scount <= 16);
	ASSERT(len % 8 == 0 && len <= 32);
	ASSERT(!crc || len != 16);
	// пароль пока не создан
	*pwd = 0;
	// определить длину частичного секрета
	if (len == 0)
	{
		// определить размер первого файла с частичным секретом
		if ((epki_len = cmdFileSize(shares[0])) == SIZE_MAX)
			return ERR_FILE_READ;
		// найти подходящую длину
		for (len = 16; len <= 32; len += 8)
		{
			code = bpkiShareWrap(0, &epki_len_min, 0, len + 1, 0, 0, 0, 10000);
			ERR_CALL_CHECK(code);
			code = bpkiShareWrap(0, &epki_len_max, 0, len + 1, 0, 0, 0, 
				SIZE_MAX);
			ERR_CALL_CHECK(code);
			if (epki_len_min <= epki_len && epki_len <= epki_len_max)
				break;
		}
		if (len > 32)
			return ERR_BAD_FORMAT;
	}
	else
	{
		code = bpkiShareWrap(0, &epki_len_min, 0, len + 1, 0, 0, 0, 10000);
		ERR_CALL_CHECK(code);
		code = bpkiShareWrap(0, &epki_len_max, 0, len + 1, 0, 0, 0,	SIZE_MAX);
		ERR_CALL_CHECK(code);
	}
	// выделить память и разметить ее
	code = cmdBlobCreate(stack, scount * (len + 1) + epki_len_max + 1 + len);
	ERR_CALL_HANDLE(code, cmdPwdClose(*pwd));
	share = state = (octet*)stack;
	epki = share + scount * (len + 1);
	pwd_bin = epki + epki_len_max + 1;
	// прочитать частичные секреты
	for (pos = 0; pos < scount; ++pos, ++shares)
	{
		size_t share_len;
		// определить длину контейнера
		code = cmdFileReadAll(0, &epki_len, *shares);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// проверить длину
		code = (epki_len_min <= epki_len && epki_len <= epki_len_max) ?
			ERR_OK : ERR_BAD_FORMAT;
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// читать
		code = cmdFileReadAll(epki, &epki_len, *shares);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// декодировать
		code = bpkiShareUnwrap(share + pos * (len + 1), &share_len,
			epki, epki_len, (const octet*)spwd, cmdPwdLen(spwd));
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		code = (share_len == len + 1) ? ERR_OK : ERR_BAD_FORMAT;
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	}
	// собрать пароль
	code = belsRecover2(pwd_bin, scount, len, share);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// проверить пароль
	if (crc)
	{
		beltMACStart(state, pwd_bin, len - 8);
		beltMACStepA(pwd_bin, len - 8, state);
		if (!beltMACStepV(pwd_bin + len - 8, state))
			code = ERR_BAD_CRC;
	}
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// создать выходной (текстовый) пароль
	*pwd = cmdPwdCreate(2 * len);
	code = *pwd ? ERR_OK : ERR_OUTOFMEMORY;
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	hexFrom(*pwd, pwd_bin, len);
	cmdBlobClose(stack);
	return code;
}